

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

void __thiscall Process::DupFd(Process *this,int from,int to)

{
  iterator iVar1;
  runtime_error *this_00;
  unordered_map<int,_FDInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_FDInfo>_>_>
  *this_01;
  FDInfo info;
  int local_70;
  int local_6c;
  FDInfo local_68;
  string local_38;
  
  this_01 = &this->files_;
  local_70 = to;
  local_6c = from;
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_FDInfo>,_std::allocator<std::pair<const_int,_FDInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_01->_M_h,&local_6c);
  if (iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur !=
      (__node_type *)0x0) {
    FDInfo::FDInfo(&local_68,to,
                   (path *)((long)iVar1.
                                  super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>.
                                  _M_cur + 0x18),false);
    iVar1 = std::
            _Hashtable<int,_std::pair<const_int,_FDInfo>,_std::allocator<std::pair<const_int,_FDInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&local_70);
    if (iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur ==
        (__node_type *)0x0) {
      std::
      _Hashtable<int,std::pair<int_const,FDInfo>,std::allocator<std::pair<int_const,FDInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int&,FDInfo&>
                ((_Hashtable<int,std::pair<int_const,FDInfo>,std::allocator<std::pair<int_const,FDInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this_01,&local_70,&local_68);
    }
    else {
      *(int *)((long)iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur +
              0x10) = local_68.Fd;
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur
                 + 0x18));
      *(undefined2 *)
       ((long)iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur + 0x38) =
           local_68._40_2_;
    }
    FDInfo::~FDInfo(&local_68);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_38,local_6c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                 "Unknown file descriptor: ",&local_38);
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Process::DupFd(int from, int to)
{
  auto it = files_.find(from);
  if (it == files_.end()) {
    throw std::runtime_error(
        "Unknown file descriptor: " + std::to_string(from)
    );
  }

  const auto &oldInfo = it->second;
  FDInfo info(to, oldInfo.Path, false);

  auto jt = files_.find(to);
  if (jt == files_.end()) {
    files_.emplace(to, info);
  } else {
    jt->second = info;
  }
}